

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveFieldLiteGenerator::GenerateFieldInfo
          (ImmutablePrimitiveFieldLiteGenerator *this,Printer *printer,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *output)

{
  bool bVar1;
  long in_RDI;
  FieldDescriptor *in_stack_00000038;
  char *in_stack_000001c0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_000001c8;
  Printer *in_stack_000001d0;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_ffffffffffffffd8;
  int value;
  
  FieldDescriptor::number(*(FieldDescriptor **)(in_RDI + 8));
  WriteIntToUtf16CharSequence((int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffd8);
  GetExperimentalJavaFieldType(in_stack_00000038);
  WriteIntToUtf16CharSequence((int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffd8);
  FieldDescriptor::file(*(FieldDescriptor **)(in_RDI + 8));
  value = (int)((ulong)in_RDI >> 0x20);
  bVar1 = SupportFieldPresence((FileDescriptor *)0x59cc62);
  if (bVar1) {
    WriteIntToUtf16CharSequence(value,in_stack_ffffffffffffffd8);
  }
  io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  return;
}

Assistant:

void ImmutablePrimitiveFieldLiteGenerator::GenerateFieldInfo(
    io::Printer* printer, std::vector<uint16>* output) const {
  WriteIntToUtf16CharSequence(descriptor_->number(), output);
  WriteIntToUtf16CharSequence(GetExperimentalJavaFieldType(descriptor_),
                              output);
  if (SupportFieldPresence(descriptor_->file())) {
    WriteIntToUtf16CharSequence(messageBitIndex_, output);
  }
  printer->Print(variables_, "\"$name$_\",\n");
}